

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaParser::ReadMetaDataItem(ColladaParser *this,StringMetaData *metadata)

{
  int iVar1;
  undefined4 extraout_var;
  char *sz;
  string camel_key_str;
  string key_str;
  aiString aistr;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  if ((char *)CONCAT44(extraout_var,iVar1) != (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&key_str,(char *)CONCAT44(extraout_var,iVar1),(allocator *)&aistr);
    sz = TestTextContent(this);
    if (sz != (char *)0x0) {
      std::__cxx11::string::string((string *)&camel_key_str,(string *)&key_str);
      ToCamelCase(&camel_key_str);
      aistr.length = 0;
      aistr.data[0] = '\0';
      memset(aistr.data + 1,0x1b,0x3ff);
      aiString::Set(&aistr,sz);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
      ::_M_emplace_unique<std::__cxx11::string&,aiString&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
                  *)metadata,&camel_key_str,&aistr);
      std::__cxx11::string::~string((string *)&camel_key_str);
    }
    TestClosing(this,key_str._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&key_str);
    return;
  }
  SkipElement(this);
  return;
}

Assistant:

void ColladaParser::ReadMetaDataItem(StringMetaData &metadata)
{
    // Metadata such as created, keywords, subject etc
    const char* key_char = mReader->getNodeName();
    if (key_char != nullptr)
    {
        const std::string key_str(key_char);
        const char* value_char = TestTextContent();
        if (value_char != nullptr)
        {
            std::string camel_key_str = key_str;
            ToCamelCase(camel_key_str);
            aiString aistr;
            aistr.Set(value_char);
            metadata.emplace(camel_key_str, aistr);
        }
        TestClosing(key_str.c_str());
    }
    else
        SkipElement();
}